

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommylist.h
# Opt level: O0

void tommy_list_insert_tail(tommy_list *list,tommy_node *node,void *data)

{
  long lVar1;
  tommy_node *head_00;
  long in_FS_OFFSET;
  tommy_node *head;
  void *data_local;
  tommy_node *node_local;
  tommy_list *list_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  head_00 = tommy_list_head(list);
  if (head_00 == (tommy_node *)0x0) {
    tommy_list_insert_first(list,node);
  }
  else {
    tommy_list_insert_tail_not_empty(head_00,node);
  }
  node->data = data;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline void tommy_list_insert_tail(tommy_list* list, tommy_node* node, void* data)
{
	tommy_node* head = tommy_list_head(list);

	if (head)
		tommy_list_insert_tail_not_empty(head, node);
	else
		tommy_list_insert_first(list, node);

	node->data = data;
}